

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsPrivateFreeDetachedArrayBuffer(void *detachedState)

{
  JsErrorCode JVar1;
  void *local_10;
  void *detachedState_local;
  
  local_10 = detachedState;
  JVar1 = GlobalAPIWrapper_NoRecord<JsPrivateFreeDetachedArrayBuffer::__0>
                    ((anon_class_8_1_44ebfe5f)&local_10);
  return JVar1;
}

Assistant:

CHAKRA_API JsPrivateFreeDetachedArrayBuffer(_In_ void* detachedState)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        auto state = reinterpret_cast<Js::ArrayBufferDetachedStateBase*>(detachedState);
        state->CleanUp();
        return JsNoError;
    });
}